

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::Delaunay3dThread::show_tet(Delaunay3dThread *this,index_t t)

{
  uint uVar1;
  char cVar2;
  ostream *poVar3;
  index_t v;
  long lVar4;
  long lVar5;
  undefined1 *puVar6;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,"tet");
  cVar2 = '*';
  if ((this->cell_next_->
      super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
      super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
      super__Vector_impl_data._M_start[t] == 0xfffffffe) {
    cVar2 = ' ';
  }
  poVar3 = std::operator<<(poVar3,cVar2);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", v=[");
  uVar1 = t * 4;
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(this->cell_to_v_store_->
                             super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar1]);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(this->cell_to_v_store_->
                             super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                             _M_impl.super__Vector_impl_data._M_start[(ulong)uVar1 + 1]);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(this->cell_to_v_store_->
                             super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                             _M_impl.super__Vector_impl_data._M_start[(ulong)uVar1 + 2]);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(this->cell_to_v_store_->
                             super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                             _M_impl.super__Vector_impl_data._M_start[(ulong)uVar1 + 3]);
  std::operator<<(poVar3,"]  adj=[");
  show_tet_adjacent(this,t,0);
  show_tet_adjacent(this,t,1);
  show_tet_adjacent(this,t,2);
  show_tet_adjacent(this,t,3);
  std::operator<<((ostream *)&std::cerr,"] ");
  puVar6 = &tet_facet_vertex_;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,'f');
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,':');
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (&std::cerr,
                          (this->cell_to_v_store_->
                          super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)(char)puVar6[lVar4] + uVar1]);
      std::operator<<(poVar3,',');
    }
    std::operator<<((ostream *)&std::cerr,' ');
    puVar6 = puVar6 + 3;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return;
}

Assistant:

void show_tet(index_t t) const {
            std::cerr << "tet"
                      << (tet_is_in_list(t) ? '*' : ' ')
                      << t
                      << ", v=["
                      << tet_vertex(t, 0)
                      << ' '
                      << tet_vertex(t, 1)
                      << ' '
                      << tet_vertex(t, 2)
                      << ' '
                      << tet_vertex(t, 3)
                      << "]  adj=[";
            show_tet_adjacent(t, 0);
            show_tet_adjacent(t, 1);
            show_tet_adjacent(t, 2);
            show_tet_adjacent(t, 3);
            std::cerr << "] ";
            
            for(index_t f = 0; f < 4; ++f) {
                std::cerr << 'f' << f << ':';
                for(index_t v = 0; v < 3; ++v) {
                    std::cerr << tet_vertex(t, tet_facet_vertex(f,v))
                              << ',';
                }
                std::cerr << ' ';
            }
            std::cerr << std::endl;
        }